

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c++
# Opt level: O3

void __thiscall kj::Arena::~Arena(Arena *this)

{
  bool bVar1;
  EVP_PKEY_CTX *in_RSI;
  UnwindDetector _kjUnwindDetector48;
  UnwindDetector local_2c;
  undefined1 local_28;
  UnwindDetector *local_20;
  Arena *local_18;
  
  UnwindDetector::UnwindDetector(&local_2c);
  local_28 = 1;
  local_20 = &local_2c;
  local_18 = this;
  cleanup(this,in_RSI);
  bVar1 = UnwindDetector::isUnwinding(&local_2c);
  if (bVar1) {
    cleanup(this,in_RSI);
  }
  return;
}

Assistant:

Arena::~Arena() noexcept(false) {
  // Run cleanup() explicitly, but if it throws an exception, make sure to run it again as part of
  // unwind.  The second call will not throw because destructors are required to guard against
  // exceptions when already unwinding.
  KJ_ON_SCOPE_FAILURE(cleanup());
  cleanup();
}